

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

int32_t __thiscall TesterThread::ACMRandom::Next(ACMRandom *this)

{
  uint uVar1;
  uint32_t hi;
  uint32_t lo;
  int32_t A;
  int32_t M;
  ACMRandom *this_local;
  
  uVar1 = ((uint)this->seed_ >> 0x10) * 0x41a7;
  lo = (uVar1 & 0x7fff) * 0x10000 + (this->seed_ & 0xffffU) * 0x41a7;
  if (0x7fffffff < lo) {
    lo = (lo & 0x7fffffff) + 1;
  }
  lo = (uVar1 >> 0xf) + lo;
  if (0x7fffffff < lo) {
    lo = (lo & 0x7fffffff) + 1;
  }
  this->seed_ = lo;
  return lo;
}

Assistant:

int32_t Next() {
      const int32_t M = 2147483647L;   // 2^31-1
      const int32_t A = 16807;
      // In effect, we are computing seed_ = (seed_ * A) % M, where M = 2^31-1
      uint32_t lo = A * (int32_t)(seed_ & 0xFFFF);
      uint32_t hi = A * (int32_t)((uint32_t)seed_ >> 16);
      lo += (hi & 0x7FFF) << 16;
      if (lo > M) {
        lo &= M;
        ++lo;
      }
      lo += hi >> 15;
      if (lo > M) {
        lo &= M;
        ++lo;
      }
      return (seed_ = (int32_t) lo);
    }